

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseTimezone(char *zDate,DateTime *p)

{
  char cVar1;
  int iVar2;
  int local_2c;
  int c;
  int nMn;
  int nHr;
  int sgn;
  DateTime *p_local;
  char *zDate_local;
  
  p_local = (DateTime *)zDate;
  while ((""[(byte)p_local->iJD] & 1) != 0) {
    p_local = (DateTime *)((long)&p_local->iJD + 1);
  }
  p->tz = 0;
  cVar1 = (char)p_local->iJD;
  if (cVar1 == '-') {
    nMn = -1;
  }
  else {
    if (cVar1 != '+') {
      if ((cVar1 != 'Z') && (cVar1 != 'z')) {
        return (uint)(cVar1 != '\0');
      }
      p_local = (DateTime *)((long)&p_local->iJD + 1);
      goto LAB_001ed1de;
    }
    nMn = 1;
  }
  p_local = (DateTime *)((long)&p_local->iJD + 1);
  _nHr = p;
  iVar2 = getDigits((char *)p_local,2,0,0xe,0x3a,&c,2,0,0x3b,0,&local_2c);
  if (iVar2 != 2) {
    return 1;
  }
  p_local = (DateTime *)((long)&p_local->iJD + 5);
  _nHr->tz = nMn * (local_2c + c * 0x3c);
LAB_001ed1de:
  while ((""[(byte)p_local->iJD] & 1) != 0) {
    p_local = (DateTime *)((long)&p_local->iJD + 1);
  }
  return (uint)((char)p_local->iJD != '\0');
}

Assistant:

static int parseTimezone(const char *zDate, DateTime *p){
  int sgn = 0;
  int nHr, nMn;
  int c;
  while( sqlite3Isspace(*zDate) ){ zDate++; }
  p->tz = 0;
  c = *zDate;
  if( c=='-' ){
    sgn = -1;
  }else if( c=='+' ){
    sgn = +1;
  }else if( c=='Z' || c=='z' ){
    zDate++;
    goto zulu_time;
  }else{
    return c!=0;
  }
  zDate++;
  if( getDigits(zDate, 2, 0, 14, ':', &nHr, 2, 0, 59, 0, &nMn)!=2 ){
    return 1;
  }
  zDate += 5;
  p->tz = sgn*(nMn + nHr*60);
zulu_time:
  while( sqlite3Isspace(*zDate) ){ zDate++; }
  return *zDate!=0;
}